

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Expr **ppWhere;
  undefined1 *puVar2;
  char **ppcVar3;
  u8 uVar4;
  i16 iVar5;
  Parse *pParse;
  sqlite3 *db;
  ExprList *pList;
  SrcList *pList_00;
  Parse *pParse_00;
  sqlite3 *db_00;
  With *pWVar6;
  SrcList *pSVar7;
  Schema *pSVar8;
  Column *pCVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Table *pTVar14;
  char *pcVar15;
  Select *pSVar16;
  Select *pSVar17;
  Table **ppTVar18;
  SrcList_item *pSVar19;
  char *__s;
  Expr *pEVar20;
  Expr *pEVar21;
  size_t sVar22;
  char *pcVar23;
  ulong uVar24;
  ExprList *pEVar25;
  long lVar26;
  ExprList_item *pEVar27;
  Schema **ppSVar28;
  With *p_1;
  With *pWVar29;
  Select *pSVar30;
  Table **ppTVar31;
  Select *pSVar32;
  With *pEList;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  SrcList *pSVar36;
  long lVar37;
  long lVar38;
  int i;
  byte *pbVar39;
  int i_1;
  uint iLeft;
  long lVar40;
  char *p_00;
  bool bVar41;
  bool bVar42;
  char *local_f0;
  Select *local_e8;
  With *local_d8;
  sqlite3 *local_b0;
  ulong local_a8;
  long local_a0;
  Select *local_90;
  ulong local_60;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar35 = p->selFlags;
  p->selFlags = uVar35 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar35 & 0x40) != 0) {
    return 1;
  }
  pList = p->pEList;
  pList_00 = p->pSrc;
  pWVar29 = p->pWith;
  if (pWVar29 != (With *)0x0) {
    pWVar29->pOuter = pParse->pWith;
    pParse->pWith = pWVar29;
  }
  sqlite3SrcListAssignCursors(pParse,pList_00);
  if (0 < pList_00->nSrc) {
    uVar35 = 0;
    pSVar19 = pList_00->a;
    do {
      bVar10 = (pSVar19->fg).field_0x1;
      uVar11 = 0;
      if ((bVar10 & 0x20) == 0) {
        pParse_00 = pWalker->pParse;
        db_00 = pParse_00->db;
        if ((pSVar19->zDatabase == (char *)0x0) &&
           (pcVar15 = pSVar19->zName, pcVar15 != (char *)0x0)) {
          local_a8 = (ulong)uVar35;
          pWVar29 = pParse_00->pWith;
          bVar42 = pWVar29 == (With *)0x0;
          local_b0 = db_00;
          if (bVar42) {
            pSVar17 = (Select *)0x0;
          }
          else {
            do {
              uVar34 = (ulong)pWVar29->nCte;
              bVar41 = 0 < (long)uVar34;
              if (0 < (long)uVar34) {
                iVar12 = sqlite3StrICmp(pcVar15,pWVar29->a[0].zName);
                if (iVar12 == 0) {
                  local_e8 = (Select *)pWVar29->a;
                  bVar41 = true;
                  local_d8 = pWVar29;
                }
                else {
                  uVar33 = 1;
                  pSVar17 = (Select *)(pWVar29 + 1);
                  do {
                    pSVar32 = pSVar17;
                    uVar24 = uVar33;
                    pSVar16 = local_e8;
                    pWVar6 = local_d8;
                    if (uVar34 == uVar24) break;
                    iVar12 = sqlite3StrICmp(pcVar15,(char *)pSVar32->pEList);
                    uVar33 = uVar24 + 1;
                    pSVar17 = (Select *)(pSVar32->addrOpenEphm + 1);
                    pSVar16 = pSVar32;
                    pWVar6 = pWVar29;
                  } while (iVar12 != 0);
                  local_d8 = pWVar6;
                  local_e8 = pSVar16;
                  bVar41 = uVar24 < uVar34;
                }
              }
              if (bVar41) break;
              pWVar29 = pWVar29->pOuter;
              bVar42 = pWVar29 == (With *)0x0;
            } while (!bVar42);
            pSVar17 = local_e8;
            if (bVar42) {
              pSVar17 = (Select *)0x0;
            }
          }
        }
        else {
          pSVar17 = (Select *)0x0;
        }
        if (pSVar17 == (Select *)0x0) {
LAB_0016ffec:
          if (pSVar19->pTab == (Table *)0x0) {
            if (pSVar19->zName == (char *)0x0) {
              iVar12 = sqlite3WalkSelect(pWalker,pSVar19->pSelect);
              uVar11 = 1;
              if ((iVar12 == 0) && (iVar12 = sqlite3ExpandSubquery(pParse,pSVar19), iVar12 == 0))
              goto LAB_0016fff3;
            }
            else {
              pTVar14 = sqlite3LocateTableItem(pParse,0,pSVar19);
              pSVar19->pTab = pTVar14;
              uVar11 = 1;
              if (pTVar14 != (Table *)0x0) {
                if (pTVar14->nTabRef < 0xffff) {
                  pTVar14->nTabRef = pTVar14->nTabRef + 1;
                  if ((pTVar14->nModuleArg != 0) || (((pSVar19->fg).field_0x1 & 4) == 0)) {
                    if ((pTVar14->nModuleArg != 0) || (pTVar14->pSelect != (Select *)0x0)) {
                      iVar12 = sqlite3ViewGetColumnNames(pParse,pTVar14);
                      if (iVar12 != 0) goto LAB_00170003;
                      pSVar17 = sqlite3SelectDup(db,pTVar14->pSelect,0);
                      pSVar19->pSelect = pSVar17;
                      iVar5 = pTVar14->nCol;
                      pTVar14->nCol = -1;
                      sqlite3WalkSelect(pWalker,pSVar17);
                      pTVar14->nCol = iVar5;
                    }
                    goto LAB_0016fff3;
                  }
                  sqlite3ErrorMsg(pParse,"\'%s\' is not a function",pSVar19->zName);
                }
                else {
                  sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar14->zName);
                  pSVar19->pTab = (Table *)0x0;
                }
              }
            }
          }
          else {
LAB_0016fff3:
            uVar11 = sqlite3IndexedByLookup(pParse,pSVar19);
          }
        }
        else {
          pcVar15 = *(char **)&pSVar17->selId;
          if ((ExprList *)pcVar15 == (ExprList *)0x0) {
            if ((bVar10 & 4) == 0) {
              pTVar14 = (Table *)sqlite3DbMallocZero(db_00,0x80);
              pSVar19->pTab = pTVar14;
              uVar11 = 1;
              if (pTVar14 != (Table *)0x0) {
                pTVar14->nTabRef = 1;
                pcVar15 = sqlite3DbStrDup(db_00,(char *)pSVar17->pEList);
                pTVar14->zName = pcVar15;
                pTVar14->iPKey = -1;
                pTVar14->nRowLogEst = 200;
                *(byte *)&pTVar14->tabFlags = (byte)pTVar14->tabFlags | 0x42;
                pSVar16 = sqlite3SelectDup(db_00,(Select *)((Cte *)&pSVar17->iLimit)->zName,0);
                pSVar19->pSelect = pSVar16;
                if (db_00->mallocFailed == '\0') {
                  bVar10 = pSVar16->op + 0x85;
                  local_a8 = CONCAT71(local_a8._1_7_,bVar10);
                  if ((bVar10 < 2) && (pSVar7 = pSVar16->pSrc, 0 < pSVar7->nSrc)) {
                    pbVar39 = &pSVar7->a[0].fg.field_0x1;
                    lVar26 = 0;
                    do {
                      if (((*(long *)(pbVar39 + -0x35) == 0) &&
                          (*(char **)(pbVar39 + -0x2d) != (char *)0x0)) &&
                         (iVar12 = sqlite3StrICmp(*(char **)(pbVar39 + -0x2d),
                                                  (char *)pSVar17->pEList), iVar12 == 0)) {
                        *(Table **)(pbVar39 + -0x1d) = pTVar14;
                        *pbVar39 = *pbVar39 | 0x20;
                        pTVar14->nTabRef = pTVar14->nTabRef + 1;
                        pbVar1 = (byte *)((long)&pSVar16->selFlags + 1);
                        *pbVar1 = *pbVar1 | 0x20;
                      }
                      lVar26 = lVar26 + 1;
                      pbVar39 = pbVar39 + 0x70;
                    } while (lVar26 < pSVar7->nSrc);
                  }
                  local_e8 = pSVar16;
                  if (pTVar14->nTabRef < 3) {
                    *(char **)&pSVar17->selId = "circular reference: %s";
                    local_b0 = (sqlite3 *)pParse_00->pWith;
                    pParse_00->pWith = local_d8;
                    if (bVar10 < 2) {
                      local_90 = pSVar16->pPrior;
                      local_90->pWith = pSVar16->pWith;
                      sqlite3WalkSelect(pWalker,local_90);
                      local_90->pWith = (With *)0x0;
                    }
                    else {
                      sqlite3WalkSelect(pWalker,pSVar16);
                    }
                    pParse_00->pWith = local_d8;
                    pSVar32 = pSVar16;
                    do {
                      pSVar30 = pSVar32;
                      pSVar32 = pSVar30->pPrior;
                    } while (pSVar32 != (Select *)0x0);
                    pWVar29 = (With *)pSVar30->pEList;
                    pWVar6 = *(With **)&pSVar17->op;
                    pEList = pWVar29;
                    if (((pWVar6 == (With *)0x0) || (pEList = pWVar6, pWVar29 == (With *)0x0)) ||
                       (pWVar29->nCte == pWVar6->nCte)) {
                      sqlite3ColumnsFromExprList
                                (pParse_00,(ExprList *)pEList,&pTVar14->nCol,&pTVar14->aCol);
                      if (bVar10 < 2) {
                        pcVar15 = "multiple recursive references: %s";
                        if ((pSVar16->selFlags >> 0xd & 1) == 0) {
                          pcVar15 = "recursive reference in a subquery: %s";
                        }
                        *(char **)&pSVar17->selId = pcVar15;
                        sqlite3WalkSelect(pWalker,pSVar16);
                      }
                      *(ExprList **)&pSVar17->selId = (ExprList *)0x0;
                      pParse_00->pWith = (With *)local_b0;
                      goto LAB_0016ffec;
                    }
                    sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                    pSVar17->pEList);
                    pParse_00->pWith = (With *)local_b0;
                  }
                  else {
                    sqlite3ErrorMsg(pParse_00,"multiple references to recursive table: %s",
                                    pSVar17->pEList);
                  }
                }
              }
              goto LAB_00170003;
            }
            pEVar25 = (ExprList *)pSVar19->zName;
            pcVar15 = "\'%s\' is not a function";
          }
          else {
            pEVar25 = pSVar17->pEList;
          }
          sqlite3ErrorMsg(pParse_00,pcVar15,pEVar25);
          uVar11 = 1;
        }
      }
LAB_00170003:
      if ((uVar11 & 0xfffffffb) != 0) {
        return 2;
      }
      uVar35 = uVar35 + 1;
      pSVar19 = pSVar19 + 1;
    } while ((int)uVar35 < pList_00->nSrc);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar7 = p->pSrc;
  if (1 < pSVar7->nSrc) {
    pSVar19 = pSVar7->a;
    pSVar36 = pSVar7 + 1;
    ppWhere = &p->pWhere;
    ppTVar18 = &pSVar7->a[0].pTab;
    lVar26 = 0;
    do {
      pTVar14 = (Table *)pSVar36->a[0].zAlias;
      bVar42 = false;
      if (pTVar14 != (Table *)0x0 && pSVar19->pTab != (Table *)0x0) {
        bVar10 = (byte)pSVar36->a[0].regReturn;
        uVar35 = (bVar10 & 0x20) >> 5;
        if ((bVar10 & 4) != 0) {
          if ((*(long *)&pSVar36->a[0].iCursor != 0) || (pSVar36->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            bVar42 = true;
            goto LAB_001703a5;
          }
          if (0 < pTVar14->nCol) {
            lVar38 = 0;
            do {
              pcVar15 = pTVar14->aCol[lVar38].zName;
              uVar34 = 0;
              ppTVar31 = ppTVar18;
              do {
                uVar11 = columnIndex(*ppTVar31,pcVar15);
                if (-1 < (int)uVar11) {
                  local_60 = uVar34 & 0xffffffff;
                  local_90 = (Select *)(ulong)uVar11;
                  break;
                }
                uVar34 = uVar34 + 1;
                ppTVar31 = ppTVar31 + 0xe;
              } while (lVar26 + 1U != uVar34);
              if (-1 < (int)uVar11) {
                addWhereTerm(pParse,pSVar7,(int)local_60,(int)local_90,(int)lVar26 + 1,(int)lVar38,
                             uVar35,ppWhere);
              }
              lVar38 = lVar38 + 1;
            } while (lVar38 < pTVar14->nCol);
          }
        }
        pEVar20 = *(Expr **)&pSVar36->a[0].iCursor;
        if (pEVar20 != (Expr *)0x0) {
          if (pSVar36->a[0].pOn != (Expr *)0x0) {
            sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
            bVar42 = true;
            goto LAB_001703a5;
          }
          if ((bVar10 & 0x20) != 0) {
            setJoinExpr(pEVar20,pSVar36->a[0].regResult);
          }
          pEVar20 = sqlite3ExprAnd(pParse->db,*ppWhere,*(Expr **)&pSVar36->a[0].iCursor);
          *ppWhere = pEVar20;
          *(undefined8 *)&pSVar36->a[0].iCursor = 0;
        }
        pEVar20 = pSVar36->a[0].pOn;
        bVar42 = false;
        if ((pEVar20 != (Expr *)0x0) && (0 < (pEVar20->u).iValue)) {
          lVar38 = 0;
          do {
            pcVar15 = *(char **)(*(long *)pEVar20 + lVar38 * 0x10);
            iVar12 = columnIndex(pTVar14,pcVar15);
            if (iVar12 < 0) {
LAB_00170378:
              sqlite3ErrorMsg(pParse,
                              "cannot join using column %s - column not present in both tables",
                              pcVar15);
              bVar42 = true;
              goto LAB_001703a5;
            }
            lVar37 = 0;
            ppTVar31 = ppTVar18;
            do {
              uVar11 = columnIndex(*ppTVar31,pcVar15);
              if (-1 < (int)uVar11) {
                iLeft = (uint)lVar37;
                uVar13 = uVar11;
                goto LAB_0017030f;
              }
              lVar37 = lVar37 + 1;
              ppTVar31 = ppTVar31 + 0xe;
            } while (lVar26 + 1 != lVar37);
            iLeft = (uint)local_b0;
            uVar13 = (uint)local_a8;
LAB_0017030f:
            local_a8 = (ulong)uVar13;
            local_b0 = (sqlite3 *)(ulong)iLeft;
            if ((int)uVar11 < 0) goto LAB_00170378;
            addWhereTerm(pParse,pSVar7,iLeft,uVar13,(int)lVar26 + 1,iVar12,uVar35,ppWhere);
            lVar38 = lVar38 + 1;
          } while (lVar38 < (pEVar20->u).iValue);
          bVar42 = false;
        }
      }
LAB_001703a5:
      if (bVar42) {
        return 2;
      }
      lVar26 = lVar26 + 1;
      pSVar36 = (SrcList *)&pSVar36->a[0].pIBIndex;
      pSVar19 = pSVar19 + 1;
    } while (lVar26 < (long)pSVar7->nSrc + -1);
  }
  uVar34 = (ulong)pList->nExpr;
  uVar35 = 0;
  bVar42 = 0 < (long)uVar34;
  if (0 < (long)uVar34) {
    pEVar27 = pList->a;
    uVar35 = 0;
    uVar33 = 1;
    do {
      pEVar20 = pEVar27->pExpr;
      uVar4 = pEVar20->op;
      if (uVar4 == 0x82) {
        uVar4 = pEVar20->pRight->op;
      }
      if (uVar4 == 0xa8) {
        if (bVar42) {
          if (0 < pList->nExpr) {
            uVar11 = (uint)pParse->db->flags & 0x44;
            lVar26 = 0;
            local_d8 = (With *)0x0;
            goto LAB_0017054a;
          }
          local_d8 = (With *)0x0;
          goto LAB_00170a47;
        }
        break;
      }
      uVar35 = uVar35 | pEVar20->flags;
      bVar42 = uVar33 < uVar34;
      pEVar27 = pEVar27 + 1;
      bVar41 = uVar33 != uVar34;
      uVar33 = uVar33 + 1;
    } while (bVar41);
  }
  goto LAB_00170a63;
LAB_0017054a:
  do {
    pEVar20 = pList->a[lVar26].pExpr;
    uVar35 = uVar35 | pEVar20->flags;
    if (pEVar20->op == 0xa8) {
      pcVar15 = (char *)0x0;
LAB_001705c9:
      if (pList_00->nSrc < 1) {
        bVar42 = true;
      }
      else {
        lVar38 = 0;
        local_a0 = -0x70;
        bVar42 = false;
        pSVar19 = pList_00->a;
        do {
          local_f0 = pSVar19->zAlias;
          pTVar14 = pSVar19->pTab;
          if (local_f0 == (char *)0x0) {
            local_f0 = pTVar14->zName;
          }
          uVar4 = db->mallocFailed;
          if (uVar4 == '\0') {
            pSVar17 = pSVar19->pSelect;
            if ((pSVar17 == (Select *)0x0) || ((pSVar17->selFlags & 0x800) == 0)) {
              if ((pcVar15 != (char *)0x0) &&
                 (iVar12 = sqlite3StrICmp(pcVar15,local_f0), iVar12 != 0)) goto LAB_00170998;
              if (pTVar14->pSchema == (Schema *)0x0) {
                uVar13 = 0xfff0bdc0;
              }
              else {
                uVar13 = 0xffffffff;
                ppSVar28 = &db->aDb->pSchema;
                do {
                  uVar13 = uVar13 + 1;
                  pSVar8 = *ppSVar28;
                  ppSVar28 = ppSVar28 + 4;
                } while (pSVar8 != pTVar14->pSchema);
              }
              if ((int)uVar13 < 0) {
                pSVar17 = (Select *)0x0;
                __s = "*";
              }
              else {
                __s = db->aDb[uVar13].zDbSName;
                pSVar17 = (Select *)0x0;
              }
            }
            else {
              __s = (char *)0x0;
            }
            if (0 < pTVar14->nCol) {
              lVar37 = 0;
              do {
                pCVar9 = pTVar14->aCol;
                pcVar23 = pCVar9[lVar37].zName;
                if (((pSVar17 == (Select *)0x0 || pcVar15 == (char *)0x0) ||
                    (iVar12 = sqlite3MatchSpanName
                                        (pSVar17->pEList->a[lVar37].zSpan,(char *)0x0,pcVar15,
                                         (char *)0x0), iVar12 != 0)) &&
                   (((p->selFlags & 0x20000) != 0 || ((pCVar9[lVar37].colFlags & 2) == 0)))) {
                  if (lVar38 != 0 && pcVar15 == (char *)0x0) {
                    if (((pSVar19->fg).jointype & 4) != 0) {
                      lVar40 = 0;
                      do {
                        iVar12 = columnIndex(*(Table **)((long)&pList_00->a[0].pTab + lVar40),
                                             pcVar23);
                        if (-1 < iVar12) break;
                        bVar42 = local_a0 != lVar40;
                        lVar40 = lVar40 + 0x70;
                      } while (bVar42);
                      bVar42 = true;
                      if (-1 < iVar12) goto LAB_00170982;
                    }
                    iVar12 = sqlite3IdListIndex(pSVar19->pUsing,pcVar23);
                    bVar42 = true;
                    if (-1 < iVar12) goto LAB_00170982;
                  }
                  pEVar20 = sqlite3Expr(db,0x3b,pcVar23);
                  if ((uVar11 == 4) || (1 < pList_00->nSrc)) {
                    pEVar21 = sqlite3Expr(db,0x3b,local_f0);
                    pEVar20 = sqlite3PExpr(pParse,0x82,pEVar21,pEVar20);
                    if (__s != (char *)0x0) {
                      sColname.z = __s;
                      sVar22 = strlen(__s);
                      sColname.n = (uint)sVar22 & 0x3fffffff;
                      pEVar21 = sqlite3ExprAlloc(db,0x3b,&sColname,0);
                      pEVar20 = sqlite3PExpr(pParse,0x82,pEVar21,pEVar20);
                    }
                    if (uVar11 != 4) goto LAB_001708a8;
                    pcVar23 = sqlite3MPrintf(db,"%s.%s",local_f0);
                    p_00 = pcVar23;
                  }
                  else {
LAB_001708a8:
                    p_00 = (char *)0x0;
                  }
                  local_d8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_d8,pEVar20);
                  sColname.z = pcVar23;
                  if (pcVar23 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    sVar22 = strlen(pcVar23);
                    sColname.n = (uint)sVar22 & 0x3fffffff;
                  }
                  sqlite3ExprListSetName(pParse,(ExprList *)local_d8,&sColname,0);
                  if ((local_d8 != (With *)0x0) && ((p->selFlags & 0x800) != 0)) {
                    iVar12 = ((ExprList *)local_d8)->nExpr;
                    if (pSVar17 == (Select *)0x0) {
                      pcVar23 = sqlite3MPrintf(db,"%s.%s.%s",__s,local_f0,pcVar23);
                    }
                    else {
                      pcVar23 = sqlite3DbStrDup(db,pSVar17->pEList->a[lVar37].zSpan);
                    }
                    ((ExprList *)local_d8)->a[(long)iVar12 + -1].zSpan = pcVar23;
                    puVar2 = &((ExprList *)local_d8)->a[(long)iVar12 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  bVar42 = true;
                  if (p_00 != (char *)0x0) {
                    sqlite3DbFreeNN(db,p_00);
                  }
                }
LAB_00170982:
                lVar37 = lVar37 + 1;
              } while (lVar37 < pTVar14->nCol);
            }
          }
LAB_00170998:
          if (uVar4 != '\0') break;
          lVar38 = lVar38 + 1;
          pSVar19 = pSVar19 + 1;
          local_a0 = local_a0 + 0x70;
        } while (lVar38 < pList_00->nSrc);
        bVar42 = !bVar42;
      }
      if (bVar42) {
        if (pcVar15 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"no tables specified");
        }
        else {
          sqlite3ErrorMsg(pParse,"no such table: %s");
        }
      }
    }
    else {
      if ((pEVar20->op == 0x82) && (pEVar20->pRight->op == 0xa8)) {
        pcVar15 = (pEVar20->pLeft->u).zToken;
        goto LAB_001705c9;
      }
      pEVar27 = pList->a + lVar26;
      local_d8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_d8,pEVar20);
      if (local_d8 != (With *)0x0) {
        pcVar15 = pEVar27->zSpan;
        ppcVar3 = &((ExprList *)local_d8)->a[(long)((ExprList *)local_d8)->nExpr + -1].zName;
        *ppcVar3 = pEVar27->zName;
        ppcVar3[1] = pcVar15;
        pEVar27->zName = (char *)0x0;
        pEVar27->zSpan = (char *)0x0;
      }
      pEVar27->pExpr = (Expr *)0x0;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 < pList->nExpr);
LAB_00170a47:
  exprListDeleteNN(db,pList);
  p->pEList = (ExprList *)local_d8;
LAB_00170a63:
  if (p->pEList == (ExprList *)0x0) {
    return 0;
  }
  if (db->aLimit[2] < p->pEList->nExpr) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    return 2;
  }
  if ((uVar35 & 0x200004) != 0) {
    pbVar39 = (byte *)((long)&p->selFlags + 2);
    *pbVar39 = *pbVar39 | 4;
    return 0;
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
  return WRC_Continue;
}